

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall ON_3dmSettings::Write_v1(ON_3dmSettings *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool local_19;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_3dmSettings *this_local;
  
  local_19 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x2000010,0);
  if (local_19) {
    local_19 = ON_3dmSettings_Write_v1_TCODE_UNIT_AND_TOLERANCES
                         (file,&this->m_ModelUnitsAndTolerances);
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      local_19 = false;
    }
  }
  return local_19;
}

Assistant:

bool ON_3dmSettings::Write_v1(ON_BinaryArchive& file) const
{
  bool rc = true;

  // version 1 units and tolerances chunk
  rc = file.BeginWrite3dmChunk(TCODE_UNIT_AND_TOLERANCES,0);
  if (rc) {
    rc = ON_3dmSettings_Write_v1_TCODE_UNIT_AND_TOLERANCES( file, m_ModelUnitsAndTolerances );
    if (!file.EndWrite3dmChunk())
      rc = false;
  }

  return rc;
}